

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

bool ViconDataStreamSDK::Core::(anonymous_namespace)::
     GetSamples<ViconCGStream::VCentreOfPressureFrame,3u>
               (vector<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
                *i_rFrames,VChannelInfo *i_rChannel,uint i_Subsample,UInt64 i_DevicePeriod,
               UInt64 i_DeviceStartTick,TPeriod *i_rFramePeriod,double (*o_rSamples) [3],
               bool *o_rbOccluded)

{
  byte bVar1;
  size_type sVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_80;
  double *local_78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  byte local_51;
  undefined1 local_50 [7];
  bool bOK;
  vector<double,_std::allocator<double>_> Samples;
  TPeriod *i_rFramePeriod_local;
  UInt64 i_DeviceStartTick_local;
  UInt64 i_DevicePeriod_local;
  uint i_Subsample_local;
  VChannelInfo *i_rChannel_local;
  vector<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
  *i_rFrames_local;
  
  Samples.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)i_rFramePeriod;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&i_rChannel->m_ComponentNames);
  if (sVar2 != 3) {
    __assert_fail("i_rChannel.m_ComponentNames.size() == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                  ,0xecb,
                  "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSamples(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const unsigned int, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, double (&)[N], bool &) [TFrame = ViconCGStream::VCentreOfPressureFrame, N = 3U]"
                 );
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  local_51 = anon_unknown_11::GetSamples<ViconCGStream::VCentreOfPressureFrame>
                       (i_rFrames,i_rChannel,i_Subsample,i_DevicePeriod,i_DeviceStartTick,
                        (TPeriod *)
                        Samples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (vector<double,_std::allocator<double>_> *)local_50,o_rbOccluded);
  if ((*o_rbOccluded & 1U) == 0) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_50);
    if (sVar2 != 3) {
      __assert_fail("Samples.size() == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                    ,0xed1,
                    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSamples(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const unsigned int, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, double (&)[N], bool &) [TFrame = ViconCGStream::VCentreOfPressureFrame, N = 3U]"
                   );
    }
    local_70._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_50);
    local_80._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_50);
    local_78 = (double *)
               __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(&local_80,3);
    std::
    copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
              (local_70,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        local_78,*o_rSamples);
  }
  bVar1 = local_51;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  return (bool)(bVar1 & 1);
}

Assistant:

bool GetSamples( const std::vector< TFrame > & i_rFrames,
                   const ViconCGStream::VChannelInfo & i_rChannel,
                   const unsigned int            i_Subsample,
                   const ViconCGStreamType::UInt64 i_DevicePeriod,
                   const ViconCGStreamType::UInt64 i_DeviceStartTick,
                   const TPeriod               & i_rFramePeriod,
                         double               (& o_rSamples)[ N ],
                         bool                  & o_rbOccluded )
  {
    assert( i_rChannel.m_ComponentNames.size() == N );
    std::vector< double > Samples;
    bool bOK = GetSamples< TFrame >( i_rFrames, i_rChannel, i_Subsample, i_DevicePeriod, i_DeviceStartTick, i_rFramePeriod, Samples, o_rbOccluded );

    if( !o_rbOccluded )
    {
      assert( Samples.size() == N );
      std::copy( Samples.begin(), Samples.begin() + N, o_rSamples );
    }

    return bOK;
  }